

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiNullHandleTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::api::(anonymous_namespace)::test<vk::VkCommandBuffer_s*>
          (TestStatus *__return_storage_ptr__,_anonymous_namespace_ *this,Context *context)

{
  VkAllocationCallbacks **this_00;
  RefData<vk::Handle<(vk::HandleType)24>_> data;
  RefData<vk::Handle<(vk::HandleType)24>_> data_00;
  DeviceInterface *vk_00;
  VkDevice device_00;
  Handle<(vk::HandleType)24> *pHVar1;
  VkAllocationCallbacks *pVVar2;
  size_t sVar3;
  size_t sVar4;
  size_t numInitialRecords;
  RefData<vk::Handle<(vk::HandleType)24>_> local_188;
  undefined1 local_168 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool_1;
  AllocationCallbackRecorder recordingAllocator;
  Move<vk::Handle<(vk::HandleType)24>_> local_d0;
  RefData<vk::Handle<(vk::HandleType)24>_> local_b0;
  undefined1 local_90 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkCommandBuffer pVStack_68;
  deUint32 numHandles;
  VkCommandBuffer pNullHandles [3];
  undefined1 local_48 [8];
  VkCommandPoolCreateInfo cmdPoolCreateInfo;
  deUint32 queueFamilyIndex;
  VkDevice device;
  DeviceInterface *vk;
  Context *context_local;
  
  vk_00 = Context::getDeviceInterface((Context *)this);
  device_00 = Context::getDevice((Context *)this);
  cmdPoolCreateInfo.pNext._4_4_ = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_48._0_4_ = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  cmdPoolCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdPoolCreateInfo._4_4_ = 0;
  cmdPoolCreateInfo.pNext._0_4_ = 1;
  pVStack_68 = (VkCommandBuffer)0x0;
  pNullHandles[0] = (VkCommandBuffer)0x0;
  pNullHandles[1] = (VkCommandBuffer)0x0;
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._4_4_ = 3;
  cmdPoolCreateInfo.queueFamilyIndex = cmdPoolCreateInfo.pNext._4_4_;
  ::vk::createCommandPool
            (&local_d0,vk_00,device_00,(VkCommandPoolCreateInfo *)local_48,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_b0,(Move *)&local_d0);
  data.deleter.m_deviceIface = local_b0.deleter.m_deviceIface;
  data.object.m_internal = local_b0.object.m_internal;
  data.deleter.m_device = local_b0.deleter.m_device;
  data.deleter.m_allocator = local_b0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_90,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_d0);
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_90);
  api::anon_unknown_1::release
            ((Context *)this,device_00,(VkCommandPool)pHVar1->m_internal,3,&stack0xffffffffffffff98)
  ;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_90);
  pVVar2 = ::vk::getSystemAllocator();
  this_00 = &cmdPool_1.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)this_00,pVVar2,1);
  pVVar2 = ::vk::AllocationCallbacks::getCallbacks((AllocationCallbacks *)this_00);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&numInitialRecords,vk_00,device_00,
             (VkCommandPoolCreateInfo *)local_48,pVVar2);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_188,(Move *)&numInitialRecords);
  data_00.deleter.m_deviceIface = local_188.deleter.m_deviceIface;
  data_00.object.m_internal = local_188.object.m_internal;
  data_00.deleter.m_device = local_188.deleter.m_device;
  data_00.deleter.m_allocator = local_188.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_168,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&numInitialRecords);
  sVar3 = ::vk::AllocationCallbackRecorder::getNumRecords
                    ((AllocationCallbackRecorder *)
                     &cmdPool_1.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                      m_allocator);
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_168);
  api::anon_unknown_1::release
            ((Context *)this,device_00,(VkCommandPool)pHVar1->m_internal,3,&stack0xffffffffffffff98)
  ;
  sVar4 = ::vk::AllocationCallbackRecorder::getNumRecords
                    ((AllocationCallbackRecorder *)
                     &cmdPool_1.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                      m_allocator);
  api::anon_unknown_1::reportStatus(__return_storage_ptr__,sVar3 == sVar4);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_168);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)
             &cmdPool_1.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test<VkCommandBuffer> (Context& context)
{
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo	cmdPoolCreateInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,		// VkStructureType             sType;
		DE_NULL,										// const void*                 pNext;
		VK_COMMAND_POOL_CREATE_TRANSIENT_BIT,			// VkCommandPoolCreateFlags    flags;
		queueFamilyIndex,								// uint32_t                    queueFamilyIndex;
	};

	const VkCommandBuffer			pNullHandles[]		= { DE_NULL, DE_NULL, DE_NULL };
	const deUint32					numHandles			= static_cast<deUint32>(DE_LENGTH_OF_ARRAY(pNullHandles));

	// Default allocator
	{
		const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, &cmdPoolCreateInfo));

		release(context, device, *cmdPool, numHandles, pNullHandles);
	}

	// Custom allocator
	{
		AllocationCallbackRecorder		recordingAllocator	(getSystemAllocator(), 1u);
		const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, &cmdPoolCreateInfo, recordingAllocator.getCallbacks()));
		const std::size_t				numInitialRecords	= recordingAllocator.getNumRecords();

		release(context, device, *cmdPool, numHandles, pNullHandles);

		return reportStatus(numInitialRecords == recordingAllocator.getNumRecords());
	}
}